

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int encodeURI_hex(StringBuffer *b,int c)

{
  int iVar1;
  uint in_ESI;
  char *hex;
  int n;
  uint8_t buf [6];
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffec;
  char acStack_10 [16];
  
  iVar1 = 1;
  if (0xff < (int)in_ESI) {
    iVar1 = 4;
  }
  (&stack0xffffffffffffffee)[iVar1] = "0123456789ABCDEF"[(int)((int)in_ESI >> 4 & 0xf)];
  (&stack0xffffffffffffffee)[iVar1 + 1] = "0123456789ABCDEF"[(int)(in_ESI & 0xf)];
  iVar1 = string_buffer_write8
                    ((StringBuffer *)CONCAT44(in_stack_ffffffffffffffec,iVar1 + 2),
                     (uint8_t *)"0123456789ABCDEF",in_stack_ffffffffffffffdc);
  return iVar1;
}

Assistant:

static int encodeURI_hex(StringBuffer *b, int c) {
    uint8_t buf[6];
    int n = 0;
    const char *hex = "0123456789ABCDEF";

    buf[n++] = '%';
    if (c >= 256) {
        buf[n++] = 'u';
        buf[n++] = hex[(c >> 12) & 15];
        buf[n++] = hex[(c >>  8) & 15];
    }
    buf[n++] = hex[(c >> 4) & 15];
    buf[n++] = hex[(c >> 0) & 15];
    return string_buffer_write8(b, buf, n);
}